

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::MultiThreadRenderCase::executeForContexts
          (MultiThreadRenderCase *this,EGLDisplay display,EGLSurface surface,Config *config,
          vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_> *contexts)

{
  pointer pDVar1;
  ostringstream *poVar2;
  deThreadPriority dVar3;
  TextureFormat log;
  SharedPtrStateBase *pSVar4;
  pointer pDVar5;
  pointer ppVar6;
  long *plVar7;
  _func_int **pp_Var8;
  _func_int **pp_Var9;
  pointer pSVar10;
  pointer pvVar11;
  pointer pSVar12;
  bool bVar13;
  EGLint EVar14;
  EGLint height;
  EGLint depthBits;
  EGLint stencilBits;
  EGLint EVar15;
  deUint32 dVar16;
  Library *egl;
  pointer drawOp;
  Semaphore *this_00;
  SharedPtrStateBase *pSVar17;
  deInt32 *pdVar18;
  Program *pPVar19;
  long *plVar20;
  int *piVar21;
  Thread *this_01;
  allocator_type *__a;
  Vec4 *color;
  bool bVar22;
  _Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  *this_02;
  uint uVar23;
  size_t __n;
  void *data;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  pointer pSVar27;
  long lVar28;
  size_type __n_00;
  pointer pDVar29;
  float depth;
  PixelFormat PVar30;
  vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_> semaphores;
  Surface refFrame;
  vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
  threads;
  vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
  packets;
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  programs;
  Surface frame;
  PixelFormat pixelFmt;
  Random rnd;
  long local_2d0;
  vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_> local_280;
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  local_268;
  Surface local_250;
  vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
  local_238;
  vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
  local_220;
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  local_208;
  TextureFormat local_1f0;
  Surface local_1e8;
  PixelFormat local_1d0;
  deRandom local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  egl = EglTestContext::getLibrary
                  ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                   super_TestCase.m_eglTestCtx);
  EVar14 = eglu::querySurfaceInt(egl,display,surface,0x3057);
  height = eglu::querySurfaceInt(egl,display,surface,0x3056);
  uVar26 = (long)(contexts->
                 super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(contexts->
                 super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  PVar30 = anon_unknown_4::getPixelFormat(egl,display,config->config);
  local_1d0 = PVar30;
  depthBits = eglu::getConfigAttribInt(egl,display,config->config,0x3025);
  stencilBits = eglu::getConfigAttribInt(egl,display,config->config,0x3026);
  EVar15 = eglu::getConfigAttribInt(egl,display,config->config,0x3031);
  log = (TextureFormat)
        ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.super_TestCase
         .super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::Surface::Surface(&local_250,EVar14,height);
  tcu::Surface::Surface(&local_1e8,EVar14,height);
  dVar16 = deStringHash((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase
                        .super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  uVar24 = (uint)(uVar26 >> 4);
  uVar23 = ((uint)(uVar26 >> 0x14) & 0xffff ^ uVar24 ^ 0x3d) * 9;
  uVar23 = (uVar23 >> 4 ^ uVar23) * 0x27d4eb2d;
  deRandom_init(&local_1c0,uVar23 >> 0xf ^ dVar16 ^ uVar23);
  __n_00 = (size_type)(int)uVar24;
  std::
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  ::vector(&local_208,__n_00,__a);
  __n = (size_t)(int)(uVar24 * 2 | 1);
  std::vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>::vector
            (&local_280,__n,(allocator_type *)local_1b0);
  iVar25 = uVar24 * 4;
  if (iVar25 < 0) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  this_02 = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
             *)(long)iVar25;
  drawOp = std::
           _Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
           ::_M_allocate(this_02,__n);
  local_268.
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = drawOp + (long)this_02;
  pDVar29 = drawOp;
  local_268.
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ._M_impl.super__Vector_impl_data._M_start = drawOp;
  if (iVar25 != 0) {
    memset(drawOp,0,(long)this_02 * 0x48);
    pDVar29 = drawOp + (long)this_02;
  }
  local_268.
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ._M_impl.super__Vector_impl_data._M_finish = pDVar29;
  std::
  vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
  ::vector(&local_220,__n_00,(allocator_type *)local_1b0);
  std::
  vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
  ::vector(&local_238,__n_00,(allocator_type *)local_1b0);
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"EGL_RED_SIZE = ",0xf);
  std::ostream::operator<<(poVar2,PVar30.redBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"EGL_GREEN_SIZE = ",0x11);
  std::ostream::operator<<(poVar2,PVar30.greenBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"EGL_BLUE_SIZE = ",0x10);
  std::ostream::operator<<(poVar2,PVar30.blueBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"EGL_ALPHA_SIZE = ",0x11);
  std::ostream::operator<<(poVar2,PVar30.alphaBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"EGL_DEPTH_SIZE = ",0x11);
  std::ostream::operator<<(poVar2,depthBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"EGL_STENCIL_SIZE = ",0x13);
  std::ostream::operator<<(poVar2,stencilBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"EGL_SAMPLES = ",0xe);
  std::ostream::operator<<(poVar2,EVar15);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  pSVar27 = local_280.
            super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_280.
      super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_280.
      super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = (Semaphore *)operator_new(8);
      de::Semaphore::Semaphore(this_00,0,0);
      pSVar17 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar17->strongRefCount = 0;
      pSVar17->weakRefCount = 0;
      pSVar17->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_02115720;
      pSVar17[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
      pSVar17->strongRefCount = 1;
      pSVar17->weakRefCount = 1;
      pSVar4 = pSVar27->m_state;
      if (pSVar4 != pSVar17) {
        if (pSVar4 != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar18 = &pSVar4->strongRefCount;
          *pdVar18 = *pdVar18 + -1;
          UNLOCK();
          if (*pdVar18 == 0) {
            pSVar27->m_ptr = (Semaphore *)0x0;
            (*pSVar27->m_state->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar18 = &pSVar27->m_state->weakRefCount;
          *pdVar18 = *pdVar18 + -1;
          UNLOCK();
          if (*pdVar18 == 0) {
            if (pSVar27->m_state != (SharedPtrStateBase *)0x0) {
              (*pSVar27->m_state->_vptr_SharedPtrStateBase[1])();
            }
            pSVar27->m_state = (SharedPtrStateBase *)0x0;
          }
        }
        pSVar27->m_ptr = this_00;
        pSVar27->m_state = pSVar17;
        LOCK();
        pSVar17->strongRefCount = pSVar17->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar18 = &pSVar27->m_state->weakRefCount;
        *pdVar18 = *pdVar18 + 1;
        UNLOCK();
      }
      pdVar18 = &pSVar17->strongRefCount;
      LOCK();
      *pdVar18 = *pdVar18 + -1;
      UNLOCK();
      if (*pdVar18 == 0) {
        (*pSVar17->_vptr_SharedPtrStateBase[2])(pSVar17);
      }
      pdVar18 = &pSVar17->weakRefCount;
      LOCK();
      *pdVar18 = *pdVar18 + -1;
      UNLOCK();
      if (*pdVar18 == 0) {
        (*pSVar17->_vptr_SharedPtrStateBase[1])(pSVar17);
      }
      pSVar27 = pSVar27 + 1;
      drawOp = local_268.
               super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pDVar29 = local_268.
                super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (pSVar27 !=
             local_280.
             super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (drawOp != pDVar29) {
    do {
      anon_unknown_4::randomizeDrawOp((Random *)&local_1c0,drawOp);
      drawOp = drawOp + 1;
    } while (drawOp != pDVar29);
  }
  if (0 < (int)uVar24) {
    uVar26 = 0;
    do {
      std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>::resize
                (local_220.
                 super__Vector_base<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar26,2);
      lVar28 = 0;
      bVar13 = true;
      do {
        bVar22 = bVar13;
        pDVar5 = local_220.
                 super__Vector_base<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar26].
                 super__Vector_base<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pDVar1 = pDVar5 + lVar28;
        iVar25 = (int)lVar28 * uVar24 + (int)uVar26;
        pSVar4 = pDVar5[lVar28].wait.m_state;
        pSVar17 = local_280.
                  super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar25].m_state;
        if (pSVar4 != pSVar17) {
          pSVar27 = local_280.
                    super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar25;
          if (pSVar4 != (SharedPtrStateBase *)0x0) {
            LOCK();
            pdVar18 = &pSVar4->strongRefCount;
            *pdVar18 = *pdVar18 + -1;
            UNLOCK();
            if (*pdVar18 == 0) {
              (pDVar1->wait).m_ptr = (Semaphore *)0x0;
              (*((pDVar1->wait).m_state)->_vptr_SharedPtrStateBase[2])();
            }
            LOCK();
            pdVar18 = &((pDVar1->wait).m_state)->weakRefCount;
            *pdVar18 = *pdVar18 + -1;
            UNLOCK();
            if (*pdVar18 == 0) {
              pSVar4 = (pDVar1->wait).m_state;
              if (pSVar4 != (SharedPtrStateBase *)0x0) {
                (*pSVar4->_vptr_SharedPtrStateBase[1])();
              }
              (pDVar1->wait).m_state = (SharedPtrStateBase *)0x0;
            }
            pSVar17 = pSVar27->m_state;
          }
          (pDVar1->wait).m_ptr = pSVar27->m_ptr;
          (pDVar1->wait).m_state = pSVar17;
          if (pSVar17 != (SharedPtrStateBase *)0x0) {
            LOCK();
            pSVar17->strongRefCount = pSVar17->strongRefCount + 1;
            UNLOCK();
            LOCK();
            pdVar18 = &((pDVar1->wait).m_state)->weakRefCount;
            *pdVar18 = *pdVar18 + 1;
            UNLOCK();
          }
        }
        pSVar4 = (pDVar1->signal).m_state;
        pSVar17 = local_280.
                  super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar25 + 1].m_state;
        if (pSVar4 != pSVar17) {
          pSVar27 = local_280.
                    super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (iVar25 + 1);
          if (pSVar4 != (SharedPtrStateBase *)0x0) {
            LOCK();
            pdVar18 = &pSVar4->strongRefCount;
            *pdVar18 = *pdVar18 + -1;
            UNLOCK();
            if (*pdVar18 == 0) {
              (pDVar1->signal).m_ptr = (Semaphore *)0x0;
              (*((pDVar1->signal).m_state)->_vptr_SharedPtrStateBase[2])();
            }
            LOCK();
            pdVar18 = &((pDVar1->signal).m_state)->weakRefCount;
            *pdVar18 = *pdVar18 + -1;
            UNLOCK();
            if (*pdVar18 == 0) {
              pSVar4 = (pDVar1->signal).m_state;
              if (pSVar4 != (SharedPtrStateBase *)0x0) {
                (*pSVar4->_vptr_SharedPtrStateBase[1])();
              }
              (pDVar1->signal).m_state = (SharedPtrStateBase *)0x0;
            }
            pSVar17 = pSVar27->m_state;
          }
          (pDVar1->signal).m_ptr = pSVar27->m_ptr;
          (pDVar1->signal).m_state = pSVar17;
          if (pSVar17 != (SharedPtrStateBase *)0x0) {
            LOCK();
            pSVar17->strongRefCount = pSVar17->strongRefCount + 1;
            UNLOCK();
            LOCK();
            pdVar18 = &((pDVar1->signal).m_state)->weakRefCount;
            *pdVar18 = *pdVar18 + 1;
            UNLOCK();
          }
        }
        pDVar1->numOps = 2;
        pDVar1->drawOps =
             local_268.
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar25 * 2;
        lVar28 = 1;
        bVar13 = false;
      } while (bVar22);
      uVar26 = uVar26 + 1;
    } while (uVar26 != (uVar24 & 0x7fffffff));
    if (0 < (int)uVar24) {
      uVar26 = (ulong)(uVar24 & 0x7fffffff);
      lVar28 = 0;
      do {
        ppVar6 = (contexts->
                 super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        EVar14 = *(EGLint *)((long)&ppVar6->first + lVar28);
        (*egl->_vptr_Library[0x27])
                  (egl,display,surface,surface,*(undefined8 *)((long)&ppVar6->second + lVar28));
        dVar16 = (*egl->_vptr_Library[0x1f])();
        eglu::checkError(dVar16,"makeCurrent(display, surface, surface, context)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                         ,0x3c6);
        pPVar19 = anon_unknown_4::createProgram(&this->m_gl,EVar14);
        plVar20 = (long *)operator_new(0x20);
        pSVar12 = local_208.
                  super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(undefined4 *)(plVar20 + 1) = 0;
        *(undefined4 *)((long)plVar20 + 0xc) = 0;
        *plVar20 = (long)&PTR__SharedPtrState_02115650;
        plVar20[2] = (long)pPVar19;
        *(undefined4 *)(plVar20 + 1) = 1;
        *(undefined4 *)((long)plVar20 + 0xc) = 1;
        plVar7 = *(long **)((long)&(local_208.
                                    super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_state + lVar28);
        if (plVar7 != plVar20) {
          if (plVar7 != (long *)0x0) {
            LOCK();
            plVar7 = plVar7 + 1;
            *(int *)plVar7 = (int)*plVar7 + -1;
            UNLOCK();
            if ((int)*plVar7 == 0) {
              *(undefined8 *)
               ((long)&(local_208.
                        super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar28) = 0;
              (**(code **)(**(long **)((long)&(local_208.
                                               super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->m_state +
                                      lVar28) + 0x10))();
            }
            LOCK();
            piVar21 = (int *)(*(long *)((long)&pSVar12->m_state + lVar28) + 0xc);
            *piVar21 = *piVar21 + -1;
            UNLOCK();
            if (*piVar21 == 0) {
              plVar7 = *(long **)((long)&pSVar12->m_state + lVar28);
              if (plVar7 != (long *)0x0) {
                (**(code **)(*plVar7 + 8))();
              }
              *(undefined8 *)((long)&pSVar12->m_state + lVar28) = 0;
            }
          }
          *(Program **)((long)&pSVar12->m_ptr + lVar28) = pPVar19;
          *(long **)((long)&pSVar12->m_state + lVar28) = plVar20;
          LOCK();
          *(int *)(plVar20 + 1) = (int)plVar20[1] + 1;
          UNLOCK();
          LOCK();
          piVar21 = (int *)(*(long *)((long)&pSVar12->m_state + lVar28) + 0xc);
          *piVar21 = *piVar21 + 1;
          UNLOCK();
        }
        plVar7 = plVar20 + 1;
        LOCK();
        *(int *)plVar7 = (int)*plVar7 + -1;
        UNLOCK();
        if ((int)*plVar7 == 0) {
          (**(code **)(*plVar20 + 0x10))(plVar20);
        }
        piVar21 = (int *)((long)plVar20 + 0xc);
        LOCK();
        *piVar21 = *piVar21 + -1;
        UNLOCK();
        if (*piVar21 == 0) {
          (**(code **)(*plVar20 + 8))(plVar20);
        }
        (**(code **)(**(long **)((long)&(local_208.
                                         super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar28)
                    + 0x10))();
        (*egl->_vptr_Library[0x27])(egl,display,0,0,0);
        dVar16 = (*egl->_vptr_Library[0x1f])();
        eglu::checkError(dVar16,
                         "makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                         ,0x3cc);
        lVar28 = lVar28 + 0x10;
        uVar26 = uVar26 - 1;
      } while (uVar26 != 0);
    }
  }
  ppVar6 = (contexts->
           super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  EVar14 = ppVar6->first;
  (*egl->_vptr_Library[0x27])(egl,display,surface,surface,ppVar6->second);
  dVar16 = (*egl->_vptr_Library[0x1f])(egl);
  iVar25 = 0x3d4;
  eglu::checkError(dVar16,"makeCurrent(display, surface, surface, context)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                   ,0x3d4);
  anon_unknown_4::clear(&this->m_gl,EVar14,color,depth,iVar25);
  anon_unknown_4::finish((Functions *)(this->m_gl).finish,EVar14);
  (*egl->_vptr_Library[0x27])(egl,display,0,0,0);
  dVar16 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar16,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                   ,0x3da);
  if (0 < (int)uVar24) {
    uVar26 = (ulong)(uVar24 & 0x7fffffff);
    local_2d0 = 0;
    lVar28 = 0;
    do {
      this_01 = (Thread *)operator_new(0x58);
      pvVar11 = local_220.
                super__Vector_base<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar6 = (contexts->
               super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      pp_Var8 = *(_func_int ***)((long)&ppVar6->second + lVar28);
      dVar3 = *(deThreadPriority *)((long)&ppVar6->first + lVar28);
      pp_Var9 = *(_func_int ***)
                 ((long)&(local_208.
                          super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar28);
      de::Thread::Thread(this_01);
      this_01->_vptr_Thread = (_func_int **)&PTR__Thread_021156e0;
      this_01[1]._vptr_Thread = (_func_int **)egl;
      *(EGLDisplay *)&this_01[1].m_attribs = display;
      this_01[1].m_thread = (deThread)surface;
      this_01[2]._vptr_Thread = pp_Var8;
      this_01[2].m_attribs.priority = dVar3;
      this_01[2].m_thread = (deThread)&this->m_gl;
      this_01[3]._vptr_Thread = pp_Var9;
      *(long *)&this_01[3].m_attribs =
           (long)&(pvVar11->
                  super__Vector_base<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>
                  )._M_impl.super__Vector_impl_data._M_start + local_2d0;
      plVar20 = (long *)operator_new(0x20);
      pSVar10 = local_238.
                super__Vector_base<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)(plVar20 + 1) = 0;
      *(undefined4 *)((long)plVar20 + 0xc) = 0;
      *plVar20 = (long)&PTR__SharedPtrState_02115760;
      plVar20[2] = (long)this_01;
      *(undefined4 *)(plVar20 + 1) = 1;
      *(undefined4 *)((long)plVar20 + 0xc) = 1;
      plVar7 = *(long **)((long)&(local_238.
                                  super__Vector_base<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_state + lVar28);
      if (plVar7 != plVar20) {
        if (plVar7 != (long *)0x0) {
          LOCK();
          plVar7 = plVar7 + 1;
          *(int *)plVar7 = (int)*plVar7 + -1;
          UNLOCK();
          if ((int)*plVar7 == 0) {
            *(undefined8 *)
             ((long)&(local_238.
                      super__Vector_base<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar28) = 0;
            (**(code **)(**(long **)((long)&(local_238.
                                             super__Vector_base<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_state +
                                    lVar28) + 0x10))();
          }
          LOCK();
          piVar21 = (int *)(*(long *)((long)&pSVar10->m_state + lVar28) + 0xc);
          *piVar21 = *piVar21 + -1;
          UNLOCK();
          if (*piVar21 == 0) {
            plVar7 = *(long **)((long)&pSVar10->m_state + lVar28);
            if (plVar7 != (long *)0x0) {
              (**(code **)(*plVar7 + 8))();
            }
            *(undefined8 *)((long)&pSVar10->m_state + lVar28) = 0;
          }
        }
        *(Thread **)((long)&pSVar10->m_ptr + lVar28) = this_01;
        *(long **)((long)&pSVar10->m_state + lVar28) = plVar20;
        LOCK();
        *(int *)(plVar20 + 1) = (int)plVar20[1] + 1;
        UNLOCK();
        LOCK();
        piVar21 = (int *)(*(long *)((long)&pSVar10->m_state + lVar28) + 0xc);
        *piVar21 = *piVar21 + 1;
        UNLOCK();
      }
      plVar7 = plVar20 + 1;
      LOCK();
      *(int *)plVar7 = (int)*plVar7 + -1;
      UNLOCK();
      if ((int)*plVar7 == 0) {
        (**(code **)(*plVar20 + 0x10))(plVar20);
      }
      piVar21 = (int *)((long)plVar20 + 0xc);
      LOCK();
      *piVar21 = *piVar21 + -1;
      UNLOCK();
      if (*piVar21 == 0) {
        (**(code **)(*plVar20 + 8))(plVar20);
      }
      de::Thread::start(*(Thread **)
                         ((long)&(local_238.
                                  super__Vector_base<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar28));
      lVar28 = lVar28 + 0x10;
      local_2d0 = local_2d0 + 0x18;
      uVar26 = uVar26 - 1;
    } while (uVar26 != 0);
  }
  deSemaphore_increment
            ((local_280.
              super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->m_ptr->m_semaphore);
  deSemaphore_decrement
            ((local_280.
              super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->m_semaphore);
  ppVar6 = (contexts->
           super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  EVar14 = ppVar6->first;
  (*egl->_vptr_Library[0x27])(egl,display,surface,surface,ppVar6->second);
  dVar16 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar16,"makeCurrent(display, surface, surface, context)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                   ,0x3ed);
  anon_unknown_4::readPixels((Functions *)(this->m_gl).readPixels,EVar14,&local_1e8);
  (*egl->_vptr_Library[0x27])(egl,display,0,0,0);
  dVar16 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar16,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                   ,0x3f2);
  if (0 < (int)uVar24) {
    uVar26 = (ulong)(uVar24 & 0x7fffffff);
    lVar28 = 0;
    do {
      de::Thread::join(*(Thread **)
                        ((long)&(local_238.
                                 super__Vector_base<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar28));
      lVar28 = lVar28 + 0x10;
      uVar26 = uVar26 - 1;
    } while (uVar26 != 0);
  }
  local_1f0.order = RGBA;
  local_1f0.type = UNORM_INT8;
  data = (void *)local_250.m_pixels.m_cap;
  if ((void *)local_250.m_pixels.m_cap != (void *)0x0) {
    data = local_250.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,&local_1f0,local_250.m_width,local_250.m_height,1,data);
  anon_unknown_4::renderReference
            ((PixelBufferAccess *)local_1b0,&local_268,&local_1d0,depthBits,stencilBits,(int)data);
  bVar13 = tcu::fuzzyCompare((TestLog *)log,"ComparisonResult","Image comparison result",&local_250,
                             &local_1e8,0.02,COMPARE_LOG_RESULT);
  if (!bVar13) {
    tcu::TestContext::setTestResult
              ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
               super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  std::
  vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
  ::~vector(&local_238);
  std::
  vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
  ::~vector(&local_220);
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ::~vector(&local_268);
  std::vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>::~vector
            (&local_280);
  std::
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  ::~vector(&local_208);
  tcu::Surface::~Surface(&local_1e8);
  tcu::Surface::~Surface(&local_250);
  return;
}

Assistant:

void MultiThreadRenderCase::executeForContexts (EGLDisplay display, EGLSurface surface, const Config& config, const std::vector<std::pair<EGLint, EGLContext> >& contexts)
{
	const Library&			egl					= m_eglTestCtx.getLibrary();
	const int				width				= eglu::querySurfaceInt(egl, display, surface, EGL_WIDTH);
	const int				height				= eglu::querySurfaceInt(egl, display, surface, EGL_HEIGHT);
	const int				numContexts			= (int)contexts.size();
	const int				opsPerPacket		= 2;
	const int				packetsPerThread	= 2;
	const int				numThreads			= numContexts;
	const int				numPackets			= numThreads * packetsPerThread;
	const float				threshold			= 0.02f;

	const tcu::PixelFormat	pixelFmt			= getPixelFormat(egl, display, config.config);
	const int				depthBits			= eglu::getConfigAttribInt(egl, display, config.config, EGL_DEPTH_SIZE);
	const int				stencilBits			= eglu::getConfigAttribInt(egl, display, config.config, EGL_STENCIL_SIZE);
	const int				numSamples			= eglu::getConfigAttribInt(egl, display, config.config, EGL_SAMPLES);

	TestLog&				log					= m_testCtx.getLog();

	tcu::Surface			refFrame			(width, height);
	tcu::Surface			frame				(width, height);

	de::Random				rnd					(deStringHash(getName()) ^ deInt32Hash(numContexts));

	// Resources that need cleanup
	vector<ProgramSp>				programs	(numContexts);
	vector<SemaphoreSp>				semaphores	(numPackets+1);
	vector<DrawPrimitiveOp>			drawOps		(numPackets*opsPerPacket);
	vector<vector<DrawOpPacket> >	packets		(numThreads);
	vector<RenderTestThreadSp>		threads		(numThreads);

	// Log basic information about config.
	log << TestLog::Message << "EGL_RED_SIZE = "		<< pixelFmt.redBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_GREEN_SIZE = "		<< pixelFmt.greenBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_BLUE_SIZE = "		<< pixelFmt.blueBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_ALPHA_SIZE = "		<< pixelFmt.alphaBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_DEPTH_SIZE = "		<< depthBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_STENCIL_SIZE = "	<< stencilBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_SAMPLES = "			<< numSamples << TestLog::EndMessage;

	// Initialize semaphores.
	for (vector<SemaphoreSp>::iterator sem = semaphores.begin(); sem != semaphores.end(); ++sem)
		*sem = SemaphoreSp(new de::Semaphore(0));

	// Create draw ops.
	for (vector<DrawPrimitiveOp>::iterator drawOp = drawOps.begin(); drawOp != drawOps.end(); ++drawOp)
		randomizeDrawOp(rnd, *drawOp);

	// Create packets.
	for (int threadNdx = 0; threadNdx < numThreads; threadNdx++)
	{
		packets[threadNdx].resize(packetsPerThread);

		for (int packetNdx = 0; packetNdx < packetsPerThread; packetNdx++)
		{
			DrawOpPacket& packet = packets[threadNdx][packetNdx];

			// Threads take turns with packets.
			packet.wait		= semaphores[packetNdx*numThreads + threadNdx];
			packet.signal	= semaphores[packetNdx*numThreads + threadNdx + 1];
			packet.numOps	= opsPerPacket;
			packet.drawOps	= &drawOps[(packetNdx*numThreads + threadNdx)*opsPerPacket];
		}
	}

	// Create and setup programs per context
	for (int ctxNdx = 0; ctxNdx < numContexts; ctxNdx++)
	{
		EGLint		api			= contexts[ctxNdx].first;
		EGLContext	context		= contexts[ctxNdx].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		programs[ctxNdx] = ProgramSp(createProgram(m_gl, api));
		programs[ctxNdx]->setup();

		// Release context
		EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
	}

	// Clear to black using first context.
	{
		EGLint		api			= contexts[0].first;
		EGLContext	context		= contexts[0].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		clear(m_gl, api, CLEAR_COLOR, CLEAR_DEPTH, CLEAR_STENCIL);
		finish(m_gl, api);

		// Release context
		EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
	}

	// Create and launch threads (actual rendering starts once first semaphore is signaled).
	for (int threadNdx = 0; threadNdx < numThreads; threadNdx++)
	{
		threads[threadNdx] = RenderTestThreadSp(new RenderTestThread(egl, display, surface, contexts[threadNdx].second, contexts[threadNdx].first, m_gl, *programs[threadNdx], packets[threadNdx]));
		threads[threadNdx]->start();
	}

	// Signal start and wait until complete.
	semaphores.front()->increment();
	semaphores.back()->decrement();

	// Read pixels using first context. \todo [pyry] Randomize?
	{
		EGLint		api		= contexts[0].first;
		EGLContext	context	= contexts[0].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		readPixels(m_gl, api, frame);
	}

	EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

	// Join threads.
	for (int threadNdx = 0; threadNdx < numThreads; threadNdx++)
		threads[threadNdx]->join();

	// Render reference.
	renderReference(refFrame.getAccess(), drawOps, pixelFmt, depthBits, stencilBits, 1);

	// Compare images
	{
		bool imagesOk = tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refFrame, frame, threshold, tcu::COMPARE_LOG_RESULT);

		if (!imagesOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}
}